

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O2

void wasm::TypeUpdating::handleNonDefaultableLocals(Function *func,Module *wasm)

{
  Index IVar1;
  uint index_00;
  pointer pTVar2;
  ulong uVar3;
  Expression **ppEVar4;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar5;
  pointer pppEVar6;
  bool bVar7;
  Type *pTVar8;
  Type TVar9;
  _Base_ptr p_Var10;
  LocalGet *pLVar11;
  size_type sVar12;
  Expression *pEVar13;
  LocalSet *this;
  RefAs *pRVar14;
  size_t sVar15;
  TupleExtract *pTVar16;
  TupleMake *right;
  Block *pBVar17;
  Builder BVar18;
  __node_base_ptr p_Var19;
  pointer pppEVar20;
  size_type *psVar21;
  pointer pTVar22;
  Type TVar23;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar24;
  optional<wasm::Type> type_00;
  undefined1 local_118 [8];
  LocalStructuralDominance info;
  undefined1 local_d0 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  badIndexes;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elems;
  Type local_78;
  Type type;
  undefined1 local_68 [8];
  uint index;
  Builder local_50;
  Builder builder;
  allocator_type local_39;
  Index *local_38;
  
  if (((wasm->features).features & 0x100) != 0) {
    pTVar22 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start;
    pTVar2 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_38 = (Index *)((ulong)local_38 & 0xffffffff00000000);
    type.id = (uintptr_t)func;
    builder.wasm = wasm;
    for (; TVar23.id = type.id, pTVar22 != pTVar2; pTVar22 = pTVar22 + 1) {
      local_118 = (undefined1  [8])pTVar22->id;
      local_d0 = (undefined1  [8])local_118;
      badIndexes._M_h._M_buckets = (__buckets_ptr)0x0;
      PVar24 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::end((Type *)local_d0);
      for (; PVar5.index = (size_t)badIndexes._M_h._M_buckets, PVar5.parent = (Type *)local_d0,
          PVar24 != PVar5;
          badIndexes._M_h._M_buckets = (__buckets_ptr)((long)badIndexes._M_h._M_buckets + 1)) {
        pTVar8 = wasm::Type::Iterator::operator*((Iterator *)local_d0);
        uVar3 = pTVar8->id;
        if (6 < uVar3 && (uVar3 & 3) == 0) {
          local_38 = (Index *)CONCAT44(local_38._4_4_,(int)CONCAT71((int7)(uVar3 >> 8),1));
          break;
        }
      }
    }
    if (((ulong)local_38 & 1) != 0) {
      LocalStructuralDominance::LocalStructuralDominance
                ((LocalStructuralDominance *)local_118,(Function *)type.id,builder.wasm,
                 NonNullableOnly);
      local_d0 = (undefined1  [8])&badIndexes._M_h._M_rehash_policy._M_next_resize;
      badIndexes._M_h._M_buckets = (__buckets_ptr)0x1;
      psVar21 = &badIndexes._M_h._M_bucket_count;
      badIndexes._M_h._M_bucket_count = 0;
      badIndexes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      badIndexes._M_h._M_element_count._0_4_ = 0x3f800000;
      badIndexes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      badIndexes._M_h._M_rehash_policy._4_4_ = 0;
      badIndexes._M_h._M_rehash_policy._M_next_resize = 0;
      for (p_Var10 = info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent; p_Var10 != (_Rb_tree_node_base *)&info;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        local_68._0_4_ = p_Var10[1]._M_color;
        std::__detail::
        _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)local_d0,(value_type *)local_68);
        TVar9 = Function::getLocalType(TVar23.id,local_68._0_4_);
        if ((TVar9.id < 7 || (TVar9.id & 3) != 0) &&
           ((TVar9 = Function::getLocalType(TVar23.id,local_68._0_4_), TVar9.id < 7 ||
            ((TVar9.id & 1) == 0)))) {
          __assert_fail("func->getLocalType(index).isNonNullable() || func->getLocalType(index).isTuple()"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp"
                        ,0x199,
                        "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)")
          ;
        }
        bVar7 = Function::isParam((Function *)TVar23.id,local_68._0_4_);
        if (bVar7) {
          __assert_fail("!func->isParam(index)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp"
                        ,0x19a,
                        "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)")
          ;
        }
      }
      if (badIndexes._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        local_50.wasm = builder.wasm;
        local_38 = (Index *)(TVar23.id + 0x60);
        FindAllPointers<wasm::LocalGet>::FindAllPointers
                  ((FindAllPointers<wasm::LocalGet> *)local_68,(Expression **)local_38);
        pppEVar6 = _index;
        for (pppEVar20 = (pointer)CONCAT44(local_68._4_4_,local_68._0_4_); pppEVar20 != pppEVar6;
            pppEVar20 = pppEVar20 + 1) {
          ppEVar4 = *pppEVar20;
          pLVar11 = Expression::cast<wasm::LocalGet>(*ppEVar4);
          sVar12 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)local_d0,&pLVar11->index);
          if (sVar12 != 0) {
            pEVar13 = fixLocalGet(pLVar11,builder.wasm);
            *ppEVar4 = pEVar13;
          }
        }
        std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
                  ((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                   local_68);
        FindAllPointers<wasm::LocalSet>::FindAllPointers
                  ((FindAllPointers<wasm::LocalSet> *)local_68,(Expression **)local_38);
        TVar23 = type;
        for (pppEVar20 = (pointer)CONCAT44(local_68._4_4_,local_68._0_4_); pppEVar20 != _index;
            pppEVar20 = pppEVar20 + 1) {
          ppEVar4 = *pppEVar20;
          this = Expression::cast<wasm::LocalSet>(*ppEVar4);
          bVar7 = Function::isVar((Function *)TVar23.id,this->index);
          if (((bVar7) && (bVar7 = LocalSet::isTee(this), bVar7)) &&
             ((this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id !=
              1)) {
            local_38 = &this->index;
            sVar12 = std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)local_d0,local_38);
            if (sVar12 != 0) {
              local_78 = Function::getLocalType(TVar23.id,*local_38);
              BVar18 = builder;
              TVar9 = getValidLocalType(local_78,(FeatureSet)((builder.wasm)->features).features);
              p_Var19 = (__node_base_ptr)CONCAT71((int7)((ulong)BVar18.wasm >> 8),local_78.id < 7);
              if ((local_78.id & 1) != 0 || local_78.id < 7) {
                if ((local_78.id < 7) || ((local_78.id & 1) == 0)) {
                  __assert_fail("type.isTuple()",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp"
                                ,0x1bd,
                                "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)"
                               );
                }
                LocalSet::makeSet(this);
                sVar15 = wasm::Type::size(&local_78);
                std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           &badIndexes._M_h._M_single_bucket,sVar15,&local_39);
                info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     wasm::Type::size(&local_78);
                for (sVar15 = 0;
                    info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                    sVar15; sVar15 = sVar15 + 1) {
                  IVar1 = *local_38;
                  pLVar11 = MixedArena::alloc<wasm::LocalGet>(&(local_50.wasm)->allocator);
                  pLVar11->index = IVar1;
                  (pLVar11->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type
                  .id = TVar9.id;
                  pTVar16 = Builder::makeTupleExtract(&local_50,(Expression *)pLVar11,(Index)sVar15)
                  ;
                  badIndexes._M_h._M_single_bucket[sVar15]._M_nxt = (_Hash_node_base *)pTVar16;
                  p_Var19 = badIndexes._M_h._M_single_bucket;
                  pTVar8 = wasm::Type::operator[](&local_78,sVar15);
                  uVar3 = pTVar8->id;
                  p_Var19 = (__node_base_ptr)CONCAT71((int7)((ulong)p_Var19 >> 8),uVar3 < 7);
                  if ((uVar3 & 3) == 0 && uVar3 >= 7) {
                    pRVar14 = Builder::makeRefAs(&local_50,RefAsNonNull,
                                                 (Expression *)
                                                 badIndexes._M_h._M_single_bucket[sVar15]._M_nxt);
                    badIndexes._M_h._M_single_bucket[sVar15]._M_nxt = (_Hash_node_base *)pRVar14;
                    p_Var19 = badIndexes._M_h._M_single_bucket;
                  }
                  TVar23.id = type.id;
                }
                right = Builder::
                        makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                                  (&local_50,
                                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)&badIndexes._M_h._M_single_bucket);
                type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._8_8_ = 0;
                type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._M_payload =
                     (_Storage<wasm::Type,_true>)p_Var19;
                pBVar17 = Builder::makeSequence
                                    (&local_50,(Expression *)this,(Expression *)right,type_00);
                *ppEVar4 = (Expression *)pBVar17;
                std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                ~_Vector_base((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               *)&badIndexes._M_h._M_single_bucket);
              }
              else {
                (this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id =
                     TVar9.id;
                pRVar14 = Builder::makeRefAs(&local_50,RefAsNonNull,(Expression *)this);
                *ppEVar4 = (Expression *)pRVar14;
              }
            }
          }
        }
        std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
                  ((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                   local_68);
        while (psVar21 = (size_type *)*psVar21, psVar21 != (size_type *)0x0) {
          index_00 = *(uint *)&((__node_base *)(psVar21 + 1))->_M_nxt;
          TVar9 = Function::getLocalType(TVar23.id,index_00);
          TVar9 = getValidLocalType(TVar9,(FeatureSet)((builder.wasm)->features).features);
          sVar15 = Function::getNumParams((Function *)TVar23.id);
          (((Function *)TVar23.id)->vars).
          super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start[index_00 - sVar15].id = TVar9.id;
        }
      }
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_d0);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_118);
    }
  }
  return;
}

Assistant:

void handleNonDefaultableLocals(Function* func, Module& wasm) {
  if (!wasm.features.hasReferenceTypes()) {
    // No references, so no non-nullable ones at all.
    return;
  }
  bool hasNonNullable = false;
  for (auto varType : func->vars) {
    for (auto type : varType) {
      if (type.isNonNullable()) {
        hasNonNullable = true;
        break;
      }
    }
  }
  if (!hasNonNullable) {
    // No non-nullable types exist in practice.
    return;
  }

  // Non-nullable locals exist, which we may need to fix up. See if they
  // validate as they are, that is, if they fall within the validation rules of
  // the wasm spec. We do not need to modify such locals.
  LocalStructuralDominance info(
    func, wasm, LocalStructuralDominance::NonNullableOnly);
  std::unordered_set<Index> badIndexes;
  for (auto index : info.nonDominatingIndices) {
    badIndexes.insert(index);

    // LocalStructuralDominance should have only looked at non-nullable indexes
    // since we told it to ignore nullable ones. Also, params always dominate
    // and should not appear here.
    assert(func->getLocalType(index).isNonNullable() ||
           func->getLocalType(index).isTuple());
    assert(!func->isParam(index));
  }
  if (badIndexes.empty()) {
    return;
  }

  // Rewrite the local.gets.
  Builder builder(wasm);
  for (auto** getp : FindAllPointers<LocalGet>(func->body).list) {
    auto* get = (*getp)->cast<LocalGet>();
    if (badIndexes.count(get->index)) {
      *getp = fixLocalGet(get, wasm);
    }
  }

  // Update tees, whose type must match the local (if the wasm spec changes for
  // the type to be that of the value, then this can be removed).
  for (auto** setp : FindAllPointers<LocalSet>(func->body).list) {
    auto* set = (*setp)->cast<LocalSet>();
    if (!func->isVar(set->index)) {
      // We do not need to process params, which can legally be non-nullable.
      continue;
    }
    // Non-tees do not change, and unreachable tees can be ignored here as their
    // type is unreachable anyhow.
    if (!set->isTee() || set->type == Type::unreachable) {
      continue;
    }
    if (badIndexes.count(set->index)) {
      auto type = func->getLocalType(set->index);
      auto validType = getValidLocalType(type, wasm.features);
      if (type.isRef()) {
        set->type = validType;
        *setp = builder.makeRefAs(RefAsNonNull, set);
      } else {
        assert(type.isTuple());
        set->makeSet();
        std::vector<Expression*> elems(type.size());
        for (size_t i = 0, size = type.size(); i < size; ++i) {
          elems[i] = builder.makeTupleExtract(
            builder.makeLocalGet(set->index, validType), i);
          if (type[i].isNonNullable()) {
            elems[i] = builder.makeRefAs(RefAsNonNull, elems[i]);
          }
        }
        *setp =
          builder.makeSequence(set, builder.makeTupleMake(std::move(elems)));
      }
    }
  }

  // Rewrite the types of the function's vars (which we can do now, after we
  // are done using them to know which local.gets etc to fix).
  for (auto index : badIndexes) {
    func->vars[index - func->getNumParams()] =
      getValidLocalType(func->getLocalType(index), wasm.features);
  }
}